

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::RepeatedMessageFieldGenerator::GenerateByteSize
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,"{\n  unsigned int count = this->$name$_size();\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&this->variables_,
                     "total_size += $tag_size$UL * count;\nfor (unsigned int i = 0; i < count; i++) {\n  total_size +=\n    ::google::protobuf::internal::WireFormatLite::$declared_type$SizeNoVirtual(\n      this->$name$(i));\n}\n"
                    );
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
GenerateByteSize(io::Printer* printer) const {
  printer->Print(variables_,
    "{\n"
    "  unsigned int count = this->$name$_size();\n");
  printer->Indent();
  printer->Print(variables_,
    "total_size += $tag_size$UL * count;\n"
    "for (unsigned int i = 0; i < count; i++) {\n"
    "  total_size +=\n"
    "    ::google::protobuf::internal::WireFormatLite::$declared_type$SizeNoVirtual(\n"
    "      this->$name$(i));\n"
    "}\n");
  printer->Outdent();
  printer->Print("}\n");
}